

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O2

void __thiscall leveldb::FileMetaData::~FileMetaData(FileMetaData *this)

{
  std::__cxx11::string::~string((string *)&this->largest);
  std::__cxx11::string::~string((string *)&this->smallest);
  return;
}

Assistant:

FileMetaData() : refs(0), allowed_seeks(1 << 30), file_size(0) {}